

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_pippenger_bucket_window(size_t n)

{
  int iVar1;
  
  iVar1 = 1;
  if ((((((1 < n) && (iVar1 = 2, 4 < n)) && (iVar1 = 3, 0x14 < n)) &&
       ((iVar1 = 4, 0x39 < n && (iVar1 = 5, 0x88 < n)))) &&
      ((iVar1 = 6, 0xeb < n && ((iVar1 = 7, 0x4ec < n && (iVar1 = 9, 0x1144 < n)))))) &&
     (iVar1 = 10, 0x1ec8 < n)) {
    iVar1 = 0xc - (uint)(n < 0x3eb3);
  }
  return iVar1;
}

Assistant:

static int secp256k1_pippenger_bucket_window(size_t n) {
    if (n <= 1) {
        return 1;
    } else if (n <= 4) {
        return 2;
    } else if (n <= 20) {
        return 3;
    } else if (n <= 57) {
        return 4;
    } else if (n <= 136) {
        return 5;
    } else if (n <= 235) {
        return 6;
    } else if (n <= 1260) {
        return 7;
    } else if (n <= 4420) {
        return 9;
    } else if (n <= 7880) {
        return 10;
    } else if (n <= 16050) {
        return 11;
    } else {
        return PIPPENGER_MAX_BUCKET_WINDOW;
    }
}